

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# envydis.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined1 uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  size_t sVar7;
  FILE *pFVar8;
  void *__ptr;
  ulong uVar9;
  int iVar10;
  uint *puVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  char type;
  ulong local_558;
  ulong local_550;
  label *local_548;
  ulong local_540;
  disisa *local_538;
  int local_530;
  uint limit;
  uint skip;
  uint base;
  undefined8 local_520;
  undefined8 local_518;
  char *local_510;
  char *local_508;
  ull uStack_500;
  undefined4 local_4f8;
  undefined4 uStack_4f4;
  FILE *local_4f0;
  label nl;
  char name [200];
  
  pFVar8 = _stdin;
  pcVar6 = __xpg_basename(*argv);
  *argv = pcVar6;
  sVar7 = strlen(pcVar6);
  uVar3 = (uint)sVar7;
  local_4f0 = pFVar8;
  if ((3 < (int)uVar3) &&
     (iVar2 = strcmp(pcVar6 + ((ulong)(uVar3 & 0x7fffffff) - 3),"dis"), iVar2 == 0)) {
    pcVar6[uVar3 - 3] = '\0';
    local_538 = ed_getisa(*argv);
    if (local_538 != (disisa *)0x0) {
      local_550 = (ulong)(local_538->opunit == 4);
      goto LAB_001683da;
    }
  }
  local_550 = 0;
  local_538 = (disisa *)0x0;
LAB_001683da:
  base = 0;
  skip = 0;
  limit = 0;
  uVar12 = 0xffffffff;
  local_530 = 0;
  local_518 = 0;
  local_510 = (char *)0x0;
  local_558 = 0;
  local_540 = 0;
  local_548 = (label *)0x0;
switchD_00168462_caseD_4e:
  iVar2 = getopt(argc,argv,"vgfpcsb:d:l:m:V:wWinqu:M:");
  switch(iVar2) {
  case 0x4d:
    pFVar8 = fopen(_optarg,"r");
    if (pFVar8 == (FILE *)0x0) {
      main_cold_1();
      return 1;
    }
    memset(&nl,0,1000);
    while (pcVar6 = fgets((char *)&nl,1000,pFVar8), pcVar6 != (char *)0x0) {
      if (((char)nl.name != '#') && ((char)nl.name != '\n')) {
        uVar3 = __isoc99_sscanf(&nl,"%c%llx%s%x",&type,&uStack_500,name,&uStack_4f4);
        if ((int)uVar3 < 2) {
          fprintf(_stderr,"Malformated input: %s\n",&nl);
        }
        else {
          switch(type) {
          case 'B':
            local_4f8 = 1;
            break;
          case 'C':
            local_4f8 = 2;
            break;
          case 'D':
            local_4f8 = 0x10;
            break;
          case 'E':
            local_4f8 = 4;
            break;
          default:
            if (type == 'N') {
              local_4f8 = 0x42;
            }
            else {
              if (type != 'S') {
                fprintf(_stderr,"Unknown label type %c\n",(ulong)(uint)(int)type);
                return 1;
              }
              local_4f8 = 0x20;
            }
          }
          if ((uVar3 < 4) && (uStack_4f4 = 0, uVar3 == 2)) {
            local_508 = (char *)0x0;
          }
          else {
            local_508 = strdup(name);
          }
          iVar4 = (int)local_540;
          iVar2 = (int)local_558;
          if (iVar2 <= iVar4) {
            uVar3 = iVar2 * 2;
            if (iVar2 == 0) {
              uVar3 = 0x10;
            }
            local_520 = uVar12;
            local_548 = (label *)realloc(local_548,(long)(int)uVar3 * 0x18);
            iVar4 = (int)local_540;
            local_558 = (ulong)uVar3;
            uVar12 = local_520;
          }
          local_540 = (ulong)(iVar4 + 1);
          local_548[iVar4].type = local_4f8;
          local_548[iVar4].size = uStack_4f4;
          local_548[iVar4].name = local_508;
          local_548[iVar4].val = uStack_500;
        }
      }
    }
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x65:
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x72:
  case 0x74:
    goto switchD_00168462_caseD_4e;
  case 0x56:
    local_510 = _optarg;
    goto switchD_00168462_caseD_4e;
  case 0x57:
    local_550 = 2;
    goto switchD_00168462_caseD_4e;
  case 0x62:
    puVar11 = &base;
    break;
  case 99:
    uVar12 = 8;
    goto switchD_00168462_caseD_4e;
  case 100:
    puVar11 = &skip;
    break;
  case 0x66:
  case 0x70:
    uVar12 = 4;
    goto switchD_00168462_caseD_4e;
  case 0x67:
    uVar12 = 2;
    goto switchD_00168462_caseD_4e;
  case 0x69:
    local_530 = 1;
    goto switchD_00168462_caseD_4e;
  case 0x6c:
    puVar11 = &limit;
    break;
  case 0x6d:
    local_538 = ed_getisa(_optarg);
    if (local_538 == (disisa *)0x0) {
      main_cold_2();
      return 1;
    }
    goto switchD_00168462_caseD_4e;
  case 0x6e:
    cnorm = "";
    cname = "";
    creg0 = "";
    creg1 = "";
    cmem = "";
    cnum = "";
    cunk = "";
    cbtarg = "";
    cctarg = "";
    cbctarg = "";
    goto switchD_00168462_caseD_4e;
  case 0x71:
    local_518 = 1;
    goto switchD_00168462_caseD_4e;
  case 0x73:
    uVar12 = 7;
    goto switchD_00168462_caseD_4e;
  case 0x75:
    __isoc99_sscanf(_optarg,"%llx",&nl.val);
    nl.type = 1;
    nl.name = (char *)0x0;
    iVar4 = (int)local_540;
    iVar2 = (int)local_558;
    if (iVar2 <= iVar4) {
      uVar3 = iVar2 * 2;
      if (iVar2 == 0) {
        uVar3 = 0x10;
      }
      local_548 = (label *)realloc(local_548,(long)(int)uVar3 * 0x18);
      iVar4 = (int)local_540;
      local_558 = (ulong)uVar3;
    }
    local_540 = (ulong)(iVar4 + 1);
    local_548[iVar4].type = nl.type;
    local_548[iVar4].size = nl.size;
    local_548[iVar4].name = nl.name;
    local_548[iVar4].val = nl.val;
    goto switchD_00168462_caseD_4e;
  case 0x76:
    uVar12 = 1;
    goto switchD_00168462_caseD_4e;
  case 0x77:
    local_550 = 1;
    goto switchD_00168462_caseD_4e;
  default:
    goto switchD_00168462_default;
  }
  __isoc99_sscanf(_optarg,"%x",puVar11);
  goto switchD_00168462_caseD_4e;
switchD_00168462_default:
  if (iVar2 == -1) goto LAB_00168831;
  goto switchD_00168462_caseD_4e;
LAB_00168831:
  pFVar8 = local_4f0;
  local_520 = uVar12;
  if (_optind < argc) {
    pFVar8 = fopen(argv[_optind],"r");
    if (pFVar8 == (FILE *)0x0) {
      perror(argv[_optind]);
      return 1;
    }
    _optind = _optind + 1;
    if (_optind < argc) {
      main_cold_4();
      return 1;
    }
  }
  pcVar6 = local_510;
  if (local_538 == (disisa *)0x0) {
    main_cold_3();
    return 1;
  }
  if (local_510 == (char *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar2 = ed_getvariant(local_538,local_510);
    if (iVar2 == 0) {
      fprintf(_stderr,"Unknown variant \"%s\"!\n",pcVar6);
      return 1;
    }
  }
  __ptr = malloc(0x10);
  if (local_530 == 0) {
    iVar4 = feof(pFVar8);
    if (iVar4 != 0) {
      return 0;
    }
    local_558 = CONCAT44(local_558._4_4_,iVar2);
    iVar2 = 0x10;
    uVar16 = 0;
    do {
      iVar4 = __isoc99_fscanf(pFVar8,"%llx",&nl);
      if (iVar4 != 1) break;
      iVar4 = (int)uVar16;
      lVar14 = (long)iVar4;
      uVar13 = lVar14 + 3;
      if (iVar2 <= (int)uVar13) {
        iVar2 = iVar2 * 2;
        __ptr = realloc(__ptr,(long)iVar2);
      }
      uVar16 = lVar14 + 1;
      *(char *)((long)__ptr + lVar14) = (char)nl.name;
      if ((int)local_550 == 0) {
        uVar16 = uVar16 & 0xffffffff;
      }
      else {
        uVar1 = (undefined1)((ulong)nl.name >> 8);
        if ((int)local_550 == 2) {
          *(undefined1 *)((long)__ptr + uVar16) = uVar1;
          *(char *)(lVar14 + 2 + (long)__ptr) = (char)((ulong)nl.name >> 0x10);
          *(char *)((long)__ptr + uVar13) = (char)((ulong)nl.name >> 0x18);
          *(char *)(lVar14 + 4 + (long)__ptr) = (char)((ulong)nl.name >> 0x20);
          iVar5 = iVar4 + 6;
          *(char *)(lVar14 + 5 + (long)__ptr) = (char)((ulong)nl.name >> 0x28);
          uVar9 = (ulong)nl.name >> 0x30;
          uVar13 = (ulong)(iVar4 + 7);
          iVar10 = 8;
        }
        else {
          iVar5 = iVar4 + 2;
          *(undefined1 *)((long)__ptr + uVar16) = uVar1;
          uVar9 = (ulong)nl.name >> 0x10;
          iVar10 = 4;
        }
        *(char *)((long)__ptr + (long)iVar5) = (char)uVar9;
        nl.name = (char *)(uVar9 >> 8);
        uVar16 = (ulong)(uint)(iVar4 + iVar10);
        *(char *)((long)__ptr + (long)(int)uVar13) = (char)(uVar9 >> 8);
      }
      __isoc99_fscanf(pFVar8," ,");
      iVar4 = feof(pFVar8);
    } while (iVar4 == 0);
  }
  else {
    iVar4 = getc(pFVar8);
    if (iVar4 == -1) {
      return 0;
    }
    iVar5 = 0x10;
    uVar16 = 0;
    do {
      if ((long)iVar5 <= (long)(uVar16 + 3)) {
        iVar5 = iVar5 * 2;
        __ptr = realloc(__ptr,(long)iVar5);
      }
      *(char *)((long)__ptr + uVar16) = (char)iVar4;
      uVar16 = uVar16 + 1;
      iVar4 = getc(pFVar8);
    } while (iVar4 != -1);
    local_558 = CONCAT44(local_558._4_4_,iVar2);
  }
  if (skip < (uint)uVar16) {
    uVar15 = (uint)uVar16 - skip;
    uVar3 = uVar15;
    if (limit < uVar15) {
      uVar3 = limit;
    }
    if (limit == 0) {
      uVar3 = uVar15;
    }
    envydis(local_538,_stdout,(uint8_t *)((long)__ptr + (ulong)skip),base,uVar3,(int)local_558,
            (int)local_520,(int)local_518,local_548,(int)local_540);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
	FILE *infile = stdin;
	const struct disisa *isa = 0;
	struct label *labels = 0;
	int labelsnum = 0;
	int labelsmax = 0;
	int w = 0, bin = 0, quiet = 0;
	const char *varname = 0;
	argv[0] = basename(argv[0]);
	int len = strlen(argv[0]);
	if (len > 3 && !strcmp(argv[0] + len - 3, "dis")) {
		argv[0][len-3] = 0;
		isa = ed_getisa(argv[0]);
		if (isa && isa->opunit == 4)
			w = 1;
	}
	int ptype = -1;
	int vartype = -1;
	int c;
	unsigned base = 0, skip = 0, limit = 0;
	while ((c = getopt (argc, argv, "vgfpcsb:d:l:m:V:wWinqu:M:")) != -1)
		switch (c) {
			case 'v':
				ptype = VP;
				break;
			case 'g':
				ptype = GP;
				break;
			case 'f':
			case 'p':
				ptype = FP;
				break;
			case 'c':
				ptype = CP;
				break;
			case 's':
				ptype = VP|GP|FP;
				break;
			case 'b':
				sscanf(optarg, "%x", &base);
				break;
			case 'd':
				sscanf(optarg, "%x", &skip);
				break;
			case 'l':
				sscanf(optarg, "%x", &limit);
				break;
			case 'w':
				w = 1;
				break;
			case 'W':
				w = 2;
				break;
			case 'i':
				bin = 1;
				break;
			case 'q':
				quiet = 1;
				break;
			case 'n':
				cnorm = "";
				cname = "";
				creg0 = "";
				creg1 = "";
				cmem = "";
				cnum = "";
				cunk = "";
				cbtarg = "";
				cctarg = "";
				cbctarg = "";
				break;
			case 'm':
				isa = ed_getisa(optarg);
				if (!isa) {
					fprintf (stderr, "Unknown architecure \"%s\"!\n", optarg);
					return 1;
				}
				break;
			case 'V':
				varname = optarg;
				break;
			case 'M':
				{
					FILE *mapfile = fopen(optarg, "r");
					if (!mapfile) {
						perror(optarg);
						return 1;
					}
					struct label nl;
					char type;
					char buf[1000] = "";

					while(fgets(buf, sizeof(buf), mapfile)) {

						if (buf[0] == '#' || buf[0] == '\n')
							continue;

						char* tmp = strchr(buf, '#');
						if (tmp)
							tmp = '\0';

						char name[200];
						int comps = sscanf(buf, "%c%llx%s%x", &type, &nl.val, name, &nl.size);;
						if (comps < 2) {
							fprintf(stderr, "Malformated input: %s\n", buf);
							continue;
						}

						switch (type) {
							case 'B':
								nl.type = 1;
								break;
							case 'C':
								nl.type = 2;
								break;
							case 'E':
								nl.type = 4;
								break;
							case 'S':
								nl.type = 0x20;
								break;
							case 'N':
								nl.type = 0x42;
								break;
							case 'D':
								nl.type = 0x10;
								break;
							default:
								fprintf (stderr, "Unknown label type %c\n", type);
								return 1;
						}
						if (comps < 4)
							nl.size = 0;
						if (comps >= 3)
							nl.name = strdup(name);
						else
							nl.name = 0;
						ADDARRAY(labels, nl);
					}
					break;
				}
			case 'u':
				{
					struct label nl;
					sscanf(optarg, "%llx", &nl.val);
					nl.type = 1;
					nl.name = 0;
					ADDARRAY(labels, nl);
					break;
				}
		}
	if (optind < argc) {
		if (!(infile = fopen(argv[optind], "r"))) {
			perror(argv[optind]);
			return 1;
		}
		optind++;
		if (optind < argc) {
			fprintf (stderr, "Too many parameters!\n");
			return 1;
		}
	}
	if (!isa) {
		fprintf (stderr, "No architecture specified!\n");
		return 1;
	}
	if (varname) {
		vartype = ed_getvariant(isa, varname);
		if (!vartype) {
			fprintf (stderr, "Unknown variant \"%s\"!\n", varname);
			return 1;
		}
	}
	int num = 0;
	int maxnum = 16;
	uint8_t *code = malloc (maxnum);
	ull t;
	if (bin) {
		int c;
		while ((c = getc(infile)) != EOF) {
			if (num + 3 >= maxnum) maxnum *= 2, code = realloc (code, maxnum);
			code[num++] = c;
		}
	} else {
		while (!feof(infile) && fscanf (infile, "%llx", &t) == 1) {
			if (num + 3 >= maxnum) maxnum *= 2, code = realloc (code, maxnum);
			if (w == 2) {
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
			} else if (w) {
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
				t >>= 8;
				code[num++] = t & 0xff;
			} else
				code[num++] = t;
			fscanf (infile, " ,");
		}
	}
	if (num <= skip)
		return 0;
	int cnt = num - skip;
	if (limit && limit < cnt)
		cnt = limit;
	envydis (isa, stdout, code+skip, base, cnt, vartype, ptype, quiet, labels, labelsnum);
	return 0;
}